

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void launch_cdef_workers(AVxWorker *workers,int num_workers)

{
  AVxWorkerInterface *pAVar1;
  AVxWorker *pAVar2;
  int in_ESI;
  long in_RDI;
  AVxWorker *worker;
  int i;
  AVxWorkerInterface *winterface;
  int local_1c;
  
  pAVar1 = aom_get_worker_interface();
  for (local_1c = in_ESI + -1; -1 < local_1c; local_1c = local_1c + -1) {
    pAVar2 = (AVxWorker *)(in_RDI + (long)local_1c * 0x38);
    pAVar2->had_error = 0;
    if (local_1c == 0) {
      (*pAVar1->execute)(pAVar2);
    }
    else {
      (*pAVar1->launch)(pAVar2);
    }
  }
  return;
}

Assistant:

static inline void launch_cdef_workers(AVxWorker *const workers,
                                       int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &workers[i];
    worker->had_error = 0;
    if (i == 0)
      winterface->execute(worker);
    else
      winterface->launch(worker);
  }
}